

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O1

FT_Error pcf_get_metric(FT_Stream stream,FT_ULong format,PCF_Metric metric)

{
  FT_Error FVar1;
  FT_Frame_Field *fields;
  PCF_Compressed_MetricRec compr;
  byte local_d;
  byte local_c;
  byte local_b;
  byte local_a;
  byte local_9;
  
  if ((format & 0xffffff00) != 0) {
    FVar1 = FT_Stream_ReadFields(stream,pcf_compressed_metric_header,&local_d);
    if (FVar1 == 0) {
      metric->leftSideBearing = local_d - 0x80;
      metric->rightSideBearing = local_c - 0x80;
      metric->characterWidth = local_b - 0x80;
      metric->ascent = local_a - 0x80;
      metric->descent = local_9 - 0x80;
      metric->attributes = 0;
    }
    return FVar1;
  }
  fields = pcf_metric_msb_header;
  if ((format & 4) == 0) {
    fields = pcf_metric_header;
  }
  FVar1 = FT_Stream_ReadFields(stream,fields,metric);
  return FVar1;
}

Assistant:

static FT_Error
  pcf_get_metric( FT_Stream   stream,
                  FT_ULong    format,
                  PCF_Metric  metric )
  {
    FT_Error  error = FT_Err_Ok;


    if ( PCF_FORMAT_MATCH( format, PCF_DEFAULT_FORMAT ) )
    {
      const FT_Frame_Field*  fields;


      /* parsing normal metrics */
      fields = ( PCF_BYTE_ORDER( format ) == MSBFirst )
               ? pcf_metric_msb_header
               : pcf_metric_header;

      /* the following sets `error' but doesn't return in case of failure */
      (void)FT_STREAM_READ_FIELDS( fields, metric );
    }
    else
    {
      PCF_Compressed_MetricRec  compr;


      /* parsing compressed metrics */
      if ( FT_STREAM_READ_FIELDS( pcf_compressed_metric_header, &compr ) )
        goto Exit;

      metric->leftSideBearing  = (FT_Short)( compr.leftSideBearing  - 0x80 );
      metric->rightSideBearing = (FT_Short)( compr.rightSideBearing - 0x80 );
      metric->characterWidth   = (FT_Short)( compr.characterWidth   - 0x80 );
      metric->ascent           = (FT_Short)( compr.ascent           - 0x80 );
      metric->descent          = (FT_Short)( compr.descent          - 0x80 );
      metric->attributes       = 0;
    }

    FT_TRACE5(( " width=%d,"
                " lsb=%d, rsb=%d,"
                " ascent=%d, descent=%d,"
                " attributes=%d\n",
                metric->characterWidth,
                metric->leftSideBearing,
                metric->rightSideBearing,
                metric->ascent,
                metric->descent,
                metric->attributes ));

  Exit:
    return error;
  }